

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapping.c
# Opt level: O1

void memory_mapping_list_add_merge_sorted_x86_64
               (MemoryMappingList *list,hwaddr phys_addr,hwaddr virt_addr,ram_addr_t length)

{
  ram_addr_t rVar1;
  ulong uVar2;
  ulong uVar3;
  MemoryMapping *pMVar4;
  
  if ((list->head).tqh_first != (MemoryMapping *)0x0) {
    pMVar4 = list->last_mapping;
    if (((pMVar4 != (MemoryMapping *)0x0) &&
        (rVar1 = pMVar4->length, pMVar4->phys_addr + rVar1 == phys_addr)) &&
       (pMVar4->virt_addr + rVar1 == virt_addr)) {
      pMVar4->length = rVar1 + length;
      return;
    }
    pMVar4 = (list->head).tqh_first;
    if (pMVar4 != (MemoryMapping *)0x0) {
      do {
        uVar2 = pMVar4->phys_addr;
        rVar1 = pMVar4->length;
        if ((rVar1 + uVar2 == phys_addr) && (pMVar4->virt_addr + rVar1 == virt_addr)) {
          pMVar4->length = rVar1 + length;
LAB_0054d51a:
          list->last_mapping = pMVar4;
          return;
        }
        if (length + phys_addr < uVar2) break;
        if ((phys_addr < rVar1 + uVar2) &&
           (uVar3 = pMVar4->virt_addr, virt_addr - uVar3 == phys_addr - uVar2)) {
          if (virt_addr < uVar3) {
            pMVar4->length = (rVar1 - virt_addr) + uVar3;
            pMVar4->virt_addr = virt_addr;
          }
          if (pMVar4->length + pMVar4->virt_addr < length + virt_addr) {
            pMVar4->length = (length + virt_addr) - pMVar4->virt_addr;
          }
          goto LAB_0054d51a;
        }
        pMVar4 = (pMVar4->next).tqe_next;
      } while (pMVar4 != (MemoryMapping *)0x0);
    }
  }
  create_new_memory_mapping(list,phys_addr,virt_addr,length);
  return;
}

Assistant:

void memory_mapping_list_add_merge_sorted(MemoryMappingList *list,
                                          hwaddr phys_addr,
                                          hwaddr virt_addr,
                                          ram_addr_t length)
{
    MemoryMapping *memory_mapping, *last_mapping;

    if (QTAILQ_EMPTY(&list->head)) {
        create_new_memory_mapping(list, phys_addr, virt_addr, length);
        return;
    }

    last_mapping = list->last_mapping;
    if (last_mapping) {
        if (mapping_contiguous(last_mapping, phys_addr, virt_addr)) {
            last_mapping->length += length;
            return;
        }
    }

    QTAILQ_FOREACH(memory_mapping, &list->head, next) {
        if (mapping_contiguous(memory_mapping, phys_addr, virt_addr)) {
            memory_mapping->length += length;
            list->last_mapping = memory_mapping;
            return;
        }

        if (phys_addr + length < memory_mapping->phys_addr) {
            /* create a new region before memory_mapping */
            break;
        }

        if (mapping_have_same_region(memory_mapping, phys_addr, length)) {
            if (mapping_conflict(memory_mapping, phys_addr, virt_addr)) {
                continue;
            }

            /* merge this region into memory_mapping */
            mapping_merge(memory_mapping, virt_addr, length);
            list->last_mapping = memory_mapping;
            return;
        }
    }

    /* this region can not be merged into any existed memory mapping. */
    create_new_memory_mapping(list, phys_addr, virt_addr, length);
}